

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

int UYVYToI422(uint8_t *src_uyvy,int src_stride_uyvy,uint8_t *dst_y,int dst_stride_y,uint8_t *dst_u,
              int dst_stride_u,uint8_t *dst_v,int dst_stride_v,int width,int height)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  code *pcVar4;
  code *pcVar5;
  code *pcVar6;
  code *pcVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  
  auVar9._0_4_ = -(uint)(src_uyvy == (uint8_t *)0x0);
  auVar9._4_4_ = -(uint)(dst_y == (uint8_t *)0x0);
  auVar9._8_4_ = -(uint)(dst_u == (uint8_t *)0x0);
  auVar9._12_4_ = -(uint)(dst_v == (uint8_t *)0x0);
  iVar3 = movmskps((int)dst_y,auVar9);
  iVar1 = -1;
  if ((height != 0 && 0 < width) && iVar3 == 0) {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      src_uyvy = src_uyvy + ~height * src_stride_uyvy;
      src_stride_uyvy = -src_stride_uyvy;
    }
    if ((dst_stride_v * 2 == width &&
         ((dst_stride_u * 2 == width && dst_stride_y == width) && width * 2 == src_stride_uyvy)) &&
       (uVar2 = iVar1 * width, dst_stride_y = width, uVar2 < 0x8001)) {
      iVar1 = 1;
      src_stride_uyvy = 0;
      dst_stride_y = 0;
      dst_stride_u = 0;
      dst_stride_v = 0;
      width = uVar2;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    bVar8 = (width & 0xfU) == 0;
    pcVar6 = UYVYToUV422Row_Any_SSE2;
    if (bVar8) {
      pcVar6 = UYVYToUV422Row_SSE2;
    }
    pcVar7 = UYVYToYRow_Any_SSE2;
    if (bVar8) {
      pcVar7 = UYVYToYRow_SSE2;
    }
    if ((uVar2 & 0x20) == 0) {
      pcVar6 = UYVYToUV422Row_C;
      pcVar7 = UYVYToYRow_C;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    bVar8 = (width & 0x1fU) == 0;
    pcVar4 = UYVYToUV422Row_Any_AVX2;
    if (bVar8) {
      pcVar4 = UYVYToUV422Row_AVX2;
    }
    pcVar5 = UYVYToYRow_Any_AVX2;
    if (bVar8) {
      pcVar5 = UYVYToYRow_AVX2;
    }
    if ((uVar2 >> 10 & 1) == 0) {
      pcVar5 = pcVar7;
      pcVar4 = pcVar6;
    }
    do {
      (*pcVar4)(src_uyvy,dst_u,dst_v,width);
      (*pcVar5)(src_uyvy,dst_y,width);
      src_uyvy = src_uyvy + src_stride_uyvy;
      dst_y = dst_y + dst_stride_y;
      dst_u = dst_u + dst_stride_u;
      dst_v = dst_v + dst_stride_v;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int UYVYToI422(const uint8_t* src_uyvy,
               int src_stride_uyvy,
               uint8_t* dst_y,
               int dst_stride_y,
               uint8_t* dst_u,
               int dst_stride_u,
               uint8_t* dst_v,
               int dst_stride_v,
               int width,
               int height) {
  int y;
  void (*UYVYToUV422Row)(const uint8_t* src_uyvy, uint8_t* dst_u,
                         uint8_t* dst_v, int width) = UYVYToUV422Row_C;
  void (*UYVYToYRow)(const uint8_t* src_uyvy, uint8_t* dst_y, int width) =
      UYVYToYRow_C;
  if (!src_uyvy || !dst_y || !dst_u || !dst_v || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_uyvy = src_uyvy + (height - 1) * src_stride_uyvy;
    src_stride_uyvy = -src_stride_uyvy;
  }
  // Coalesce rows.
  if (src_stride_uyvy == width * 2 && dst_stride_y == width &&
      dst_stride_u * 2 == width && dst_stride_v * 2 == width &&
      width * height <= 32768) {
    width *= height;
    height = 1;
    src_stride_uyvy = dst_stride_y = dst_stride_u = dst_stride_v = 0;
  }
#if defined(HAS_UYVYTOYROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    UYVYToUV422Row = UYVYToUV422Row_Any_SSE2;
    UYVYToYRow = UYVYToYRow_Any_SSE2;
    if (IS_ALIGNED(width, 16)) {
      UYVYToUV422Row = UYVYToUV422Row_SSE2;
      UYVYToYRow = UYVYToYRow_SSE2;
    }
  }
#endif
#if defined(HAS_UYVYTOYROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    UYVYToUV422Row = UYVYToUV422Row_Any_AVX2;
    UYVYToYRow = UYVYToYRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      UYVYToUV422Row = UYVYToUV422Row_AVX2;
      UYVYToYRow = UYVYToYRow_AVX2;
    }
  }
#endif
#if defined(HAS_UYVYTOYROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    UYVYToYRow = UYVYToYRow_Any_NEON;
    UYVYToUV422Row = UYVYToUV422Row_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      UYVYToYRow = UYVYToYRow_NEON;
      UYVYToUV422Row = UYVYToUV422Row_NEON;
    }
  }
#endif
#if defined(HAS_UYVYTOYROW_MMI) && defined(HAS_UYVYTOUV422ROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    UYVYToYRow = UYVYToYRow_Any_MMI;
    UYVYToUV422Row = UYVYToUV422Row_Any_MMI;
    if (IS_ALIGNED(width, 16)) {
      UYVYToYRow = UYVYToYRow_MMI;
      UYVYToUV422Row = UYVYToUV422Row_MMI;
    }
  }
#endif
#if defined(HAS_UYVYTOYROW_MSA) && defined(HAS_UYVYTOUV422ROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    UYVYToYRow = UYVYToYRow_Any_MSA;
    UYVYToUV422Row = UYVYToUV422Row_Any_MSA;
    if (IS_ALIGNED(width, 32)) {
      UYVYToYRow = UYVYToYRow_MSA;
      UYVYToUV422Row = UYVYToUV422Row_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    UYVYToUV422Row(src_uyvy, dst_u, dst_v, width);
    UYVYToYRow(src_uyvy, dst_y, width);
    src_uyvy += src_stride_uyvy;
    dst_y += dst_stride_y;
    dst_u += dst_stride_u;
    dst_v += dst_stride_v;
  }
  return 0;
}